

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall RoomBase::handle(RoomBase *this,Event *event)

{
  pointer *ppPVar1;
  uint64_t uVar2;
  iterator __position;
  size_t __n;
  undefined8 uVar3;
  int iVar4;
  PlayerInfo *player;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> _Var5;
  pointer pPVar6;
  pointer pPVar7;
  long lVar8;
  PlayerInfo *player_1;
  pointer pPVar9;
  uint uVar10;
  int8_t *piVar11;
  ulong uVar12;
  ulong uVar13;
  iterator __begin4;
  PlayerInfo *pPVar14;
  iterator __end4;
  pointer __args;
  bool bVar15;
  bool bVar16;
  float fVar17;
  TTimestamp TVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Event event_1;
  _Any_data local_a8;
  code *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_90;
  undefined1 local_88;
  undefined7 uStack_87;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_48;
  vector<Query,_std::allocator<Query>_> *local_40;
  pointer local_38;
  
  uVar3 = local_a8._8_8_;
  switch(event->type) {
  case StartNewRound:
    if (event->roomId == this->id) {
      this->roundId = this->roundId + 1;
      std::vector<Query,_std::allocator<Query>_>::_M_erase_at_end
                (&this->pool,
                 (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<Query,_std::allocator<Query>_>::_M_erase_at_end
                (&this->poolOld,
                 (this->poolOld).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if ((ulong)(((long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3) <
          (ulong)(long)this->poolSize) {
        do {
          (**this->_vptr_RoomBase)(&local_a8,this);
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                    (&this->pool,(Query *)&local_a8);
          if (local_70[0] != &local_60) {
            operator_delete(local_70[0],local_60._M_allocated_capacity + 1);
          }
          if (paStack_90 != &local_80) {
            operator_delete(paStack_90,local_80._0_8_ + 1);
          }
        } while ((ulong)(((long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3)
                 < (ulong)(long)this->poolSize);
      }
      _Var5 = std::
              __remove_if<__gnu_cxx::__normal_iterator<PlayerInfo*,std::vector<PlayerInfo,std::allocator<PlayerInfo>>>,__gnu_cxx::__ops::_Iter_pred<RoomBase::handle(Event&&)::_lambda(auto:1_const&)_1_>>
                        ((this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      pPVar14 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((_Var5._M_current != pPVar14) &&
         (pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
         pPVar6 = (pointer)((long)_Var5._M_current + ((long)pPVar7 - (long)pPVar14)),
         pPVar7 != pPVar6)) {
        (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
        super__Vector_impl_data._M_finish = pPVar6;
      }
      pPVar6 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar6; pPVar7 = pPVar7 + 1)
      {
        pPVar7->score = 0.0;
        pPVar7->active = '\x01';
      }
      if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
        handle();
      }
      lVar8 = std::chrono::_V2::steady_clock::now();
      lVar8 = lVar8 / 1000000 - anon_unknown.dwarf_113e3::timestamp_s::tStart;
      auVar21._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar21._0_8_ = lVar8;
      auVar21._12_4_ = 0x45300000;
      this->tRoundStart_s =
           ((auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * 0.001;
      if (this->mode == BattleRoyale) {
        this->tRoundLength_s = this->tBRRoundLength_s;
      }
      local_a8._8_8_ = 0;
      paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:205:37)>
                      ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:205:37)>
                 ::_M_manager;
      local_a8._M_unused._M_object = this;
      Notifier::notify(&this->notifier,(function<void_()> *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,3);
      }
    }
    break;
  case CheckStart:
    if (event->roomId == this->id) {
      if (this->mode == BattleRoyale) {
        pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pPVar6 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (pPVar7 != pPVar6) {
          uVar10 = 0;
          do {
            uVar10 = (uVar10 + 1) - (uint)(pPVar7->active == '\0');
            pPVar7 = pPVar7 + 1;
          } while (pPVar7 != pPVar6);
          if (1 < uVar10) {
            TVar18 = anon_unknown.dwarf_113e3::timestamp_s();
            auVar23._0_8_ = (double)CONCAT44(0x43300000,(int)this->tTimeBetweenRounds_ms);
            auVar23._8_4_ = (int)(this->tTimeBetweenRounds_ms >> 0x20);
            auVar23._12_4_ = 0x45300000;
            this->tNextRoundStart_s =
                 ((auVar23._8_8_ - 1.9342813113834067e+25) + (auVar23._0_8_ - 4503599627370496.0)) *
                 0.001 + TVar18;
            local_a8._8_8_ = 0;
            paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:248:53)>
                            ::_M_invoke;
            local_98 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:248:53)>
                       ::_M_manager;
            local_a8._M_unused._M_object = this;
            Notifier::notify(&this->notifier,(function<void_()> *)&local_a8);
            if (local_98 == (code *)0x0) {
              return;
            }
            (*local_98)(&local_a8,&local_a8,3);
            return;
          }
        }
        TVar18 = anon_unknown.dwarf_113e3::timestamp_s();
        auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)this->tTimeBetweenRounds_ms);
        auVar24._8_4_ = (int)(this->tTimeBetweenRounds_ms >> 0x20);
        auVar24._12_4_ = 0x45300000;
        this->tNextRoundStart_s =
             ((auVar24._8_8_ - 1.9342813113834067e+25) + (auVar24._0_8_ - 4503599627370496.0)) *
             0.001 + TVar18;
        local_a8._8_8_ = 0;
        paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:260:53)>
                        ::_M_invoke;
        local_98 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:260:53)>
                   ::_M_manager;
        local_a8._M_unused._M_object = this;
        Notifier::notify(&this->notifier,(function<void_()> *)&local_a8);
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,3);
        }
      }
      else if (this->mode == Standard) {
        if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
          handle();
        }
        lVar8 = std::chrono::_V2::steady_clock::now();
        lVar8 = lVar8 / 1000000 - anon_unknown.dwarf_113e3::timestamp_s::tStart;
        auVar20._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar20._0_8_ = lVar8;
        auVar20._12_4_ = 0x45300000;
        uVar2 = this->tTimeBetweenRounds_ms;
        auVar25._8_4_ = (int)(uVar2 >> 0x20);
        auVar25._0_8_ = uVar2;
        auVar25._12_4_ = 0x45300000;
        this->tNextRoundStart_s =
             ((auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 0.001 +
             ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * 0.001;
        local_a8._8_8_ = 0;
        paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:225:49)>
                        ::_M_invoke;
        local_98 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:225:49)>
                   ::_M_manager;
        local_a8._M_unused._M_object = this;
        Notifier::notify(&this->notifier,(function<void_()> *)&local_a8);
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,3);
        }
      }
    }
    break;
  case EndRound:
    local_a8._4_4_ = this->id;
    if (event->roomId == local_a8._4_4_) {
      if (this->mode == BattleRoyale) {
        uVar10 = 0;
        printf("Room %d: ending BR round %d\n",(ulong)(uint)local_a8._4_4_,
               (ulong)(uint)this->roundId);
        pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pPVar6 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        pPVar9 = pPVar7;
        if (pPVar7 != pPVar6) {
          do {
            uVar10 = uVar10 + (pPVar9->active == '\x01');
            pPVar9 = pPVar9 + 1;
          } while (pPVar9 != pPVar6);
          if (2 < uVar10) {
            uVar10 = (int)((long)pPVar6 - (long)pPVar7 >> 2) * -0x55555555;
            if ((int)uVar10 < 1) {
              lVar8 = -1;
            }
            else {
              piVar11 = &pPVar7->active;
              fVar17 = 1e+06;
              uVar13 = 0xffffffff;
              uVar12 = 0;
              do {
                if ((*(float *)(piVar11 + -4) < fVar17) && (*piVar11 == '\x01')) {
                  uVar13 = uVar12 & 0xffffffff;
                  fVar17 = *(float *)(piVar11 + -4);
                }
                uVar12 = uVar12 + 1;
                piVar11 = piVar11 + 0xc;
              } while ((uVar10 & 0x7fffffff) != uVar12);
              lVar8 = (long)(int)uVar13;
            }
            pPVar7[lVar8].active = '\x02';
            this->tRoundLength_s = this->tBRRoundLength_s + this->tRoundLength_s;
            local_a8._8_8_ = 0;
            paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:324:53)>
                            ::_M_invoke;
            local_98 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:324:53)>
                       ::_M_manager;
            local_a8._M_unused._M_object = this;
            Notifier::notify(&this->notifier,(function<void_()> *)&local_a8);
            if (local_98 == (code *)0x0) {
              return;
            }
            (*local_98)(&local_a8,&local_a8,3);
            return;
          }
        }
        printf("Room %d: ending round\n",(ulong)(uint)this->id);
        local_98 = (code *)&local_88;
        local_a8._8_4_ = 0xffffffff;
        paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        local_88 = 0;
        local_a8._4_4_ = this->id;
        local_a8._0_4_ = 2;
        Events::push((this->notifier).events,(Event *)&local_a8);
      }
      else {
        if (this->mode != Standard) {
          return;
        }
        local_98 = (code *)&local_88;
        local_a8._8_4_ = 0xffffffff;
        paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        local_88 = 0;
        local_a8._0_4_ = 2;
        Events::push((this->notifier).events,(Event *)&local_a8);
      }
      if (local_98 != (code *)&local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
    }
    break;
  case PlayerJoinRoom:
    pPVar14 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    bVar15 = pPVar14 == __position._M_current;
    if (event->roomId != this->id) {
      for (; pPVar14 != __position._M_current; pPVar14 = pPVar14 + 1) {
        uVar10 = event->clientId;
        if (pPVar14->clientId == uVar10) {
          pPVar14->active = '\0';
          printf("Client (%d) left room \'%s\' (%d)\n",(ulong)uVar10,(this->name)._M_dataplus._M_p,
                 (ulong)(uint)this->id);
        }
      }
      return;
    }
    if (pPVar14 != __position._M_current) {
      iVar4 = pPVar14->clientId;
      while (iVar4 != event->clientId) {
        pPVar14 = pPVar14 + 1;
        bVar15 = pPVar14 == __position._M_current;
        if (bVar15) goto LAB_00109835;
        iVar4 = pPVar14->clientId;
      }
      pPVar14->active = '\x01';
      if (!bVar15) {
        return;
      }
    }
LAB_00109835:
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    if (this->mode == Standard) {
      local_a8._M_pod_data[8] = 1;
LAB_00109c19:
      local_a8._9_7_ = SUB87(uVar3,1);
    }
    else if (this->mode == BattleRoyale) {
      local_a8._M_pod_data[8] = 2;
      goto LAB_00109c19;
    }
    local_a8._4_4_ = 0;
    local_a8._0_4_ = event->clientId;
    if (__position._M_current ==
        (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::_M_realloc_insert<PlayerInfo>
                (&this->players,__position,(PlayerInfo *)&local_a8);
    }
    else {
      *(undefined4 *)&(__position._M_current)->active = local_a8._8_4_;
      *(void **)__position._M_current = local_a8._M_unused._M_object;
      ppPVar1 = &(this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    printf("Client (%d) joined room \'%s\' (%d)\n",(ulong)(uint)event->clientId,
           (this->name)._M_dataplus._M_p,(ulong)(uint)this->id);
    break;
  case PlayerInput:
    if (event->roomId == this->id) {
      if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
        handle();
      }
      lVar8 = std::chrono::_V2::steady_clock::now();
      lVar8 = lVar8 / 1000000 - anon_unknown.dwarf_113e3::timestamp_s::tStart;
      auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar19._0_8_ = lVar8;
      auVar19._12_4_ = 0x45300000;
      if (((auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * 0.001 <=
          this->tRoundStart_s + this->tRoundLength_s) {
        pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar10 = (int)((long)(this->players).
                             super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pPVar7 >> 2) * -0x55555555;
        iVar4 = -1;
        if (0 < (int)uVar10) {
          uVar12 = 0;
          pPVar6 = pPVar7;
          do {
            if (pPVar6->clientId == event->clientId) {
              iVar4 = (int)uVar12;
              break;
            }
            uVar12 = uVar12 + 1;
            pPVar6 = pPVar6 + 1;
          } while ((uVar10 & 0x7fffffff) != uVar12);
        }
        if ((iVar4 != -1) && (pPVar7[iVar4].active == '\x01')) {
          printf("Room %d: client %d submitted \'%s\'\n",(ulong)(uint)this->id,
                 (ulong)(uint)event->clientId,(event->inputStr)._M_dataplus._M_p);
          pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar4;
          __args = (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_38 = (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          if (__args != local_38) {
            local_40 = &this->poolOld;
            bVar15 = false;
            local_48 = pPVar7;
            do {
              __n = (event->inputStr)._M_string_length;
              uVar12 = (__args->answer)._M_string_length;
              if (__n == uVar12) {
                if (__n == 0) {
                  bVar16 = true;
                }
                else {
                  iVar4 = bcmp((event->inputStr)._M_dataplus._M_p,(__args->answer)._M_dataplus._M_p,
                               __n);
                  bVar16 = iVar4 == 0;
                }
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                local_48->score = (float)uVar12 * 0.2 + 3.0 + local_48->score;
                __args->clientId = event->clientId;
                if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
                  handle();
                }
                lVar8 = std::chrono::_V2::steady_clock::now();
                lVar8 = lVar8 / 1000000 - anon_unknown.dwarf_113e3::timestamp_s::tStart;
                auVar22._8_4_ = (int)((ulong)lVar8 >> 0x20);
                auVar22._0_8_ = lVar8;
                auVar22._12_4_ = 0x45300000;
                __args->tGuessed_s =
                     ((auVar22._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * 0.001;
                std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(local_40,__args);
                (**this->_vptr_RoomBase)(&local_a8,this);
                __args->tGuessed_s = (TTimestamp)local_98;
                *(void **)__args = local_a8._M_unused._M_object;
                *(undefined8 *)&__args->clientId = local_a8._8_8_;
                std::__cxx11::string::operator=((string *)&__args->text,(string *)&paStack_90);
                std::__cxx11::string::operator=((string *)&__args->answer,(string *)local_70);
                if (local_70[0] != &local_60) {
                  operator_delete(local_70[0],local_60._M_allocated_capacity + 1);
                }
                if (paStack_90 != &local_80) {
                  operator_delete(paStack_90,local_80._0_8_ + 1);
                }
                puts("correct!");
                bVar15 = true;
              }
              __args = __args + 1;
            } while (!(bool)(bVar16 | __args == local_38));
            pPVar7 = local_48;
            if (bVar15) {
              return;
            }
          }
          puts("wrong!");
          fVar17 = pPVar7->score + -1.0;
          pPVar7->score = fVar17;
          if (fVar17 < 0.0) {
            pPVar7->score = 0.0;
          }
        }
      }
    }
    break;
  default:
    printf("Unhandled event, type = %d\n");
    return;
  }
  return;
}

Assistant:

virtual void handle(Event && event) {
        switch (event.type) {
            case Event::StartNewRound:
                {
                    if (event.roomId != id) return;

                    ++roundId;
                    //printf("Room %d: starting new round %d\n", id, roundId);

                    pool.clear();
                    poolOld.clear();
                    while (pool.size() < poolSize) {
                        pool.emplace_back(generate());
                    }

                    players.erase(std::remove_if(players.begin(), players.end(),
                                                 [](const auto & p) { return p.active == 0; }),
                                  players.end());

                    for (auto & player : players) {
                        player.score = 0.0f;
                        player.active = 1;
                    }

                    tRoundStart_s = timestamp_s();

                    switch (mode) {
                        case Standard:
                            {
                            }
                            break;
                        case BattleRoyale:
                            {
                                tRoundLength_s = tBRRoundLength_s;
                            }
                            break;
                    };

                    notifier.notify([&]() {
                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tRoundLength_s)));

                        Event event;
                        event.roomId = id;
                        event.type = Event::EndRound;

                        notifier.events->push(std::move(event));
                    });
                }
                break;
            case Event::CheckStart:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                notifier.notify([&]() {
                                    std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::StartNewRound;

                                    notifier.events->push(std::move(event));
                                });
                            }
                            break;
                        case BattleRoyale:
                            {
                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active != 0) {
                                        ++nActive;
                                    }
                                }

                                if (nActive > 1) {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::StartNewRound;

                                        notifier.events->push(std::move(event));
                                    });
                                } else {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenChecks_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::CheckStart;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::EndRound:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                //printf("Room %d: ending round %d\n", id, roundId);

                                Event event;
                                event.roomId = id;
                                event.type = Event::CheckStart;

                                notifier.events->push(std::move(event));
                            }
                            break;
                        case BattleRoyale:
                            {
                                printf("Room %d: ending BR round %d\n", id, roundId);

                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active == 1) {
                                        ++nActive;
                                    }
                                }

                                if (nActive <= 2) {
                                    printf("Room %d: ending round\n", id);

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::CheckStart;

                                    notifier.events->push(std::move(event));
                                } else {
                                    int playerId = -1;
                                    float minScore = 1e6;
                                    for (int i = 0; i < (int) players.size(); ++i) {
                                        if (players[i].score < minScore && players[i].active == 1) {
                                            minScore = players[i].score;
                                            playerId = i;
                                        }
                                    }

                                    players[playerId].active = 2;

                                    tRoundLength_s += tBRRoundLength_s;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tBRRoundLength_s)));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::EndRound;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::PlayerJoinRoom:
                {
                    if (event.roomId == id) {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 1;
                                return;
                            }
                        }

                        PlayerInfo player;

                        switch (mode) {
                            case Standard:
                                {
                                    player.active = 1;
                                }
                                break;
                            case BattleRoyale:
                                {
                                    player.active = 2;
                                }
                                break;
                        };
                        player.clientId = event.clientId;

                        players.emplace_back(std::move(player));

                        printf("Client (%d) joined room '%s' (%d)\n", event.clientId, name.c_str(), id);
                    } else {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 0;

                                printf("Client (%d) left room '%s' (%d)\n", event.clientId, name.c_str(), id);
                            }
                        }
                    }
                }
                break;
            case Event::PlayerInput:
                {
                    if (event.roomId != id) return;
                    if (::timestamp_s() > tRoundStart_s + tRoundLength_s) return;

                    int playerId = -1;
                    for (int i = 0; i < (int) players.size(); ++i) {
                        if (players[i].clientId == event.clientId) {
                            playerId = i;
                            break;
                        }
                    }

                    if (playerId == -1) return;
                    if (players[playerId].active != 1) return;

                    printf("Room %d: client %d submitted '%s'\n", id, event.clientId, event.inputStr.data());

                    auto & player = players[playerId];

                    bool correct = false;
                    for (auto & query : pool) {
                        if (event.inputStr == query.answer) {
                            player.score += 3.0f + 0.2f*query.answer.size();
                            correct = true;
                            query.clientId = event.clientId;
                            query.tGuessed_s = ::timestamp_s();
                            poolOld.emplace_back(std::move(query));
                            query = generate();
                            printf("correct!\n");

                            break;
                        }
                    }

                    if (correct == false) {
                        printf("wrong!\n");
                        player.score -= 1.0f;
                        if (player.score < 0.0) player.score = 0.0f;
                    }
                }
                break;
            default:
                {
                    printf("Unhandled event, type = %d\n", event.type);
                }
                break;
        };
    }